

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_heap.h
# Opt level: O3

void __thiscall csbpl_common::Heap<double>::insert(Heap<double> *this,Ptr *e)

{
  double dVar1;
  double *pdVar2;
  pointer psVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Ptr temp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  ((e->super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ->heap_index_ =
       (int)((ulong)((long)(this->data_).
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->data_).
                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ::push_back(&this->data_,e);
  iVar5 = (int)((ulong)((long)(this->data_).
                              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->data_).
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (2 < iVar5 + 1U) {
    iVar4 = iVar5 + -1;
    iVar5 = (iVar5 - (iVar5 + -2 >> 0x1f)) + -2 >> 1;
    do {
      psVar3 = (this->data_).
               super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar2 = &(psVar3[iVar4].
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->key_;
      dVar1 = (psVar3[iVar5].
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->key_;
      if (dVar1 < *pdVar2 || dVar1 == *pdVar2) {
        return;
      }
      local_38._M_pi =
           psVar3[iVar4].
           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
          UNLOCK();
          psVar3 = (this->data_).
                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
        }
      }
      psVar3[iVar4].
      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar3[iVar5].
           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&psVar3[iVar4].
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &psVar3[iVar5].
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      psVar3 = (this->data_).
               super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(int *)((long)psVar3[iVar4].
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 8) = iVar4;
      psVar3 = psVar3 + iVar5;
      (psVar3->super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)pdVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(psVar3->
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_38);
      *(int *)((long)(this->data_).
                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar5].
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 8) = iVar5;
      if (iVar5 == 0) {
        iVar6 = -1;
      }
      else {
        iVar6 = (iVar5 - (iVar5 + -1 >> 0x1f)) + -1 >> 1;
      }
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      iVar4 = iVar5;
      iVar5 = iVar6;
    } while (iVar6 != -1);
  }
  return;
}

Assistant:

void insert(Ptr e)
  {
    e->heap_index_ = static_cast<int>(data_.size());
    data_.push_back(e);

    // Percolate up
    int i = size() - 1;
    int parent = getParent(i);
    while (parent != -1 && data_[i]->key_ < data_[parent]->key_)
    {
      // Perform a swap
      Ptr temp = data_[i];
      data_[i] = data_[parent];
      data_[i]->heap_index_ = i;
      data_[parent] = temp;
      data_[parent]->heap_index_ = parent;
      // Continue to percolate up the tree
      i = parent;
      parent = getParent(parent);
    }
  }